

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_solid_source_out(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)length;
  if (const_alpha == 0xff) {
    uVar4 = 0;
    if (length < 1) {
      uVar3 = 0;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = BYTE_MUL(color,~dest[uVar4] >> 0x18);
      dest[uVar4] = uVar1;
    }
  }
  else {
    uVar1 = BYTE_MUL(color,const_alpha);
    uVar4 = 0;
    if (length < 1) {
      uVar3 = 0;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = INTERPOLATE_PIXEL(uVar1,~dest[uVar4] >> 0x18,dest[uVar4],0xff - const_alpha);
      dest[uVar4] = uVar2;
    }
  }
  return;
}

Assistant:

static void composition_solid_source_out(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(color, plutovg_alpha(~dest[i]));
        }
    } else {
        color = BYTE_MUL(color, const_alpha);
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            dest[i] = INTERPOLATE_PIXEL(color, plutovg_alpha(~d), d, cia);
        }
    }
}